

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.h
# Opt level: O2

IntResult * __thiscall
slang::parsing::NumberParser::parseInteger<slang::parsing::Preprocessor,true>
          (IntResult *__return_storage_ptr__,NumberParser *this,Preprocessor *stream)

{
  IntResult *pIVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  SourceLocation SVar5;
  Info *pIVar6;
  ulong uVar10;
  int iVar11;
  bool isNegated;
  Token baseToken;
  Token sizeToken_00;
  Token TVar12;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar13;
  Token TVar14;
  Token sizeToken;
  Token first;
  Token token;
  Token local_d8;
  Token local_c8;
  Token local_b0;
  IntResult *local_a0;
  Token local_98;
  Token local_88;
  Token local_78;
  Token local_68;
  Token local_50;
  Token local_40;
  undefined8 uVar7;
  undefined8 uVar8;
  Info *pIVar9;
  
  uVar10 = (ulong)(stream->lastConsumed).kind;
  Token::Token(&local_c8);
  Token::Token(&local_d8);
  TVar12 = Preprocessor::consume(stream);
  local_88 = TVar12;
  local_78._0_8_ = uVar10;
  if (TVar12.kind == IntegerBase) {
    local_d8 = TVar12;
    Token::Token(&local_40);
  }
  else {
    local_b0.info = (Info *)&local_88;
    local_b0._0_8_ = this;
    bVar3 = Preprocessor::peekSameLine(stream);
    if ((!bVar3) ||
       (TVar14 = Preprocessor::peek(stream), TVar12 = local_88, TVar14.kind != IntegerBase)) {
      parseInteger<slang::parsing::Preprocessor,_true>::anon_class_16_2_f88ffae6::operator()
                (__return_storage_ptr__,(anon_class_16_2_f88ffae6 *)&local_b0);
      return __return_storage_ptr__;
    }
    local_c8.kind = local_88.kind;
    local_c8._2_1_ = local_88._2_1_;
    local_c8.numFlags.raw = local_88.numFlags.raw;
    local_c8.rawLen = local_88.rawLen;
    local_c8.info = local_88.info;
    local_88 = TVar12;
    TVar12 = Preprocessor::consume(stream);
    local_40._0_8_ = local_c8._0_8_;
    local_40.info = local_c8.info;
    local_d8 = TVar12;
  }
  TVar14.info = local_40.info;
  TVar14.kind = local_40.kind;
  TVar14._2_1_ = local_40._2_1_;
  TVar14.numFlags.raw = local_40.numFlags.raw;
  TVar14.rawLen = local_40.rawLen;
  startVector(this,TVar12,TVar14);
  local_a0 = __return_storage_ptr__;
  bVar3 = Preprocessor::peekSameLine(stream);
  pIVar6 = local_c8.info;
  uVar7 = local_c8._0_8_;
  if (bVar3) {
    local_b0 = Preprocessor::peek(stream);
    bVar3 = slang::syntax::SyntaxFacts::isPossibleVectorDigit(local_b0.kind);
    if (bVar3) {
      local_98 = local_b0;
      SVar5 = Token::location(&local_b0);
      this->firstLocation = SVar5;
      iVar2 = 0;
      while( true ) {
        iVar11 = iVar2;
        uVar4 = append(this,local_98,iVar11 == 0);
        Preprocessor::consume(stream);
        if (-1 < (int)uVar4) {
          Preprocessor::handleExponentSplit(stream,local_98,(ulong)uVar4);
          bVar3 = false;
          goto LAB_001ae79b;
        }
        bVar3 = Preprocessor::peekSameLine(stream);
        if (!bVar3) break;
        local_98 = Preprocessor::peek(stream);
        bVar3 = slang::syntax::SyntaxFacts::isPossibleVectorDigit(local_98.kind);
        if ((!bVar3) ||
           (sVar13 = Token::trivia(&local_98), iVar2 = iVar11 + -1,
           sVar13._M_extent._M_extent_value._M_extent_value != 0)) break;
      }
      bVar3 = iVar11 == 0;
LAB_001ae79b:
      TVar12 = local_d8;
      isNegated = local_78._0_4_ == 0x23;
      local_78.kind = local_c8.kind;
      local_78._2_1_ = local_c8._2_1_;
      local_78.numFlags.raw = local_c8.numFlags.raw;
      local_78.rawLen = local_c8.rawLen;
      local_78.info = local_c8.info;
      local_68.kind = local_d8.kind;
      local_68._2_1_ = local_d8._2_1_;
      local_68.numFlags.raw = local_d8.numFlags.raw;
      local_68.rawLen = local_d8.rawLen;
      local_68.info = local_d8.info;
      local_d8 = TVar12;
      TVar12 = finishValue(this,local_b0,bVar3,isNegated);
      (local_a0->size).kind = local_78.kind;
      (local_a0->size).field_0x2 = local_78._2_1_;
      (local_a0->size).numFlags = (NumericTokenFlags)local_78.numFlags.raw;
      (local_a0->size).rawLen = local_78.rawLen;
      (local_a0->size).info = local_78.info;
      (local_a0->base).kind = local_68.kind;
      (local_a0->base).field_0x2 = local_68._2_1_;
      (local_a0->base).numFlags = (NumericTokenFlags)local_68.numFlags.raw;
      (local_a0->base).rawLen = local_68.rawLen;
      (local_a0->base).info = local_68.info;
      local_a0->value = TVar12;
      local_a0->isSimple = false;
      return local_a0;
    }
    pIVar6 = local_c8.info;
    uVar7 = local_c8._0_8_;
    uVar8 = local_d8._0_8_;
    pIVar9 = local_d8.info;
    local_50._0_8_ = local_b0._0_8_;
    local_50.info = local_b0.info;
  }
  else {
    uVar8 = local_d8._0_8_;
    pIVar9 = local_d8.info;
    Token::Token(&local_50);
  }
  pIVar1 = local_a0;
  TVar12.info = local_50.info;
  TVar12.kind = local_50.kind;
  TVar12._2_1_ = local_50._2_1_;
  TVar12.numFlags.raw = local_50.numFlags.raw;
  TVar12.rawLen = local_50.rawLen;
  baseToken.info = pIVar9;
  baseToken.kind = (TokenKind)uVar8;
  baseToken._2_1_ = SUB81(uVar8,2);
  baseToken.numFlags.raw = SUB81(uVar8,3);
  baseToken.rawLen = SUB84(uVar8,4);
  sizeToken_00.info = pIVar6;
  sizeToken_00.kind = (TokenKind)uVar7;
  sizeToken_00._2_1_ = SUB81(uVar7,2);
  sizeToken_00.numFlags.raw = SUB81(uVar7,3);
  sizeToken_00.rawLen = SUB84(uVar7,4);
  reportMissingDigits(local_a0,this,sizeToken_00,baseToken,TVar12);
  return pIVar1;
}

Assistant:

IntResult parseInteger(TStream& stream) {
        const bool isNegated = stream.getLastConsumed().kind == TokenKind::Minus;

        Token sizeToken;
        Token baseToken;

        auto token = stream.consume();
        if (token.kind == TokenKind::IntegerBase) {
            baseToken = token;
            startVector(baseToken, Token());
        }
        else {
            auto createSimple = [&] {
                checkIntOverflow(token);
                return IntResult::simple(token);
            };

            if constexpr (RequireSameLine) {
                if (!stream.peekSameLine())
                    return createSimple();
            }

            if (!stream.peek(TokenKind::IntegerBase))
                return createSimple();

            sizeToken = token;
            baseToken = stream.consume();
            startVector(baseToken, sizeToken);
        }

        if constexpr (RequireSameLine) {
            if (!stream.peekSameLine())
                return reportMissingDigits(sizeToken, baseToken, Token());
        }

        // At this point we expect to see vector digits, but they could be split out into other
        // token types because of hex literals.
        auto first = stream.peek();
        if (!syntax::SyntaxFacts::isPossibleVectorDigit(first.kind))
            return reportMissingDigits(sizeToken, baseToken, first);

        int count = 0;
        Token next = first;
        firstLocation = first.location();

        do {
            count++;
            int index = append(next, count == 1);
            stream.consume();

            if (index >= 0) {
                // This handles a really obnoxious case: 'h 3e+2
                // The second token is initially lexed as a real literal, but we need to split
                // it apart here now that we know it's a hex literal and put the remaining (new)
                // tokens back on the parser's stack.
                stream.handleExponentSplit(next, (size_t)index);

                // Bump the count so that we definitely take the modified raw text
                // instead of trying to use the initial token's raw directly.
                count++;
                break;
            }

            if constexpr (RequireSameLine) {
                if (!stream.peekSameLine())
                    break;
            }

            next = stream.peek();
        } while (syntax::SyntaxFacts::isPossibleVectorDigit(next.kind) && next.trivia().empty());

        return IntResult::vector(sizeToken, baseToken, finishValue(first, count == 1, isNegated));
    }